

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O2

int X509_policy_check(X509_POLICY_TREE **ptree,int *pexplicit_policy,stack_st_X509 *certs,
                     stack_st_ASN1_OBJECT *policy_oids,uint flags)

{
  byte bVar1;
  OPENSSL_STACK *sk;
  int iVar2;
  uint uVar3;
  OPENSSL_STACK *pOVar4;
  X509 *x;
  X509_POLICY_LEVEL *level;
  size_t sVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  OPENSSL_STACK *pOVar8;
  X509_POLICY_NODE *pXVar9;
  POLICY_MAPPING *a;
  ASN1_OBJECT *pAVar10;
  X509_POLICY_NODE *pXVar11;
  POLICY_CONSTRAINTS *a_00;
  ASN1_INTEGER *skip_certs;
  OPENSSL_STACK *pOVar12;
  size_t sVar13;
  ASN1_OBJECT *pAVar14;
  void *pvVar15;
  size_t i;
  X509_POLICY_LEVEL *pXVar16;
  size_t i_1;
  ulong uVar17;
  ulong i_00;
  bool bVar18;
  int local_a4;
  OPENSSL_STACK *local_a0;
  OPENSSL_STACK *local_98;
  OPENSSL_STACK *local_90;
  OPENSSL_STACK *local_88;
  size_t explicit_policy;
  size_t policy_mapping;
  size_t inhibit_any_policy;
  size_t local_68;
  OPENSSL_STACK *local_60;
  OPENSSL_STACK *local_58;
  stack_st_ASN1_OBJECT *local_50;
  OPENSSL_STACK *local_48;
  OPENSSL_STACK *local_40;
  OPENSSL_STACK *local_38;
  
  *(undefined8 *)&policy_oids->stack = 0;
  pOVar4 = (OPENSSL_STACK *)OPENSSL_sk_num((OPENSSL_STACK *)ptree);
  if (pOVar4 < (OPENSSL_STACK *)0x2) {
    return 0;
  }
  policy_mapping = (long)&pOVar4->num + 1;
  uVar3 = (uint)certs;
  explicit_policy = (size_t)(undefined1 *)0x0;
  if ((uVar3 >> 8 & 1) == 0) {
    explicit_policy = policy_mapping;
  }
  inhibit_any_policy = (size_t)(undefined1 *)0x0;
  if ((uVar3 >> 9 & 1) == 0) {
    inhibit_any_policy = policy_mapping;
  }
  if ((uVar3 >> 10 & 1) != 0) {
    policy_mapping = (size_t)(undefined1 *)0x0;
  }
  local_88 = OPENSSL_sk_new_null();
  local_98 = (OPENSSL_STACK *)0x11;
  if (local_88 != (OPENSSL_STACK *)0x0) {
    local_58 = (OPENSSL_STACK *)((long)&pOVar4[-1].comp + 6);
    level = (X509_POLICY_LEVEL *)0x0;
    pOVar8 = local_58;
    local_60 = (OPENSSL_STACK *)pexplicit_policy;
    local_50 = policy_oids;
    local_48 = pOVar4;
    local_40 = (OPENSSL_STACK *)ptree;
LAB_002d4497:
    if (local_48 <= pOVar8) {
      if (explicit_policy != 0) {
        pOVar4 = (OPENSSL_STACK *)0x0;
        goto LAB_002d4ce4;
      }
      if (local_60 == (OPENSSL_STACK *)0x0) {
        pOVar4 = (OPENSSL_STACK *)0x0;
      }
      else {
        pOVar4 = OPENSSL_sk_dup(local_60);
        if (pOVar4 == (OPENSSL_STACK *)0x0) goto LAB_002d4c91;
        OPENSSL_sk_set_cmp_func(pOVar4,asn1_object_cmp);
        sk_ASN1_OBJECT_sort((stack_st_ASN1_OBJECT *)pOVar4);
        iVar2 = OPENSSL_sk_is_sorted(pOVar4);
        if (iVar2 == 0) {
          __assert_fail("user_policies == NULL || sk_ASN1_OBJECT_is_sorted(user_policies)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                        ,0x24d,
                        "int has_explicit_policy(struct stack_st_X509_POLICY_LEVEL *, const struct stack_st_ASN1_OBJECT *)"
                       );
        }
      }
      sk = local_88;
      pOVar12 = (OPENSSL_STACK *)OPENSSL_sk_num(local_88);
      pOVar8 = (OPENSSL_STACK *)((long)&pOVar12[-1].comp + 7);
      pXVar16 = (X509_POLICY_LEVEL *)OPENSSL_sk_value(sk,(size_t)pOVar8);
      iVar2 = x509_policy_level_is_empty(pXVar16);
      if (iVar2 != 0) {
LAB_002d4db1:
        local_98 = (OPENSSL_STACK *)0x2b;
        goto LAB_002d4c94;
      }
      sVar5 = OPENSSL_sk_num(pOVar4);
      uVar17 = 0;
      goto LAB_002d4dfd;
    }
    x = (X509 *)OPENSSL_sk_value(local_40,(size_t)pOVar8);
    iVar2 = x509v3_cache_extensions((X509 *)x);
    pOVar4 = (OPENSSL_STACK *)0x0;
    if (iVar2 == 0) goto LAB_002d4c94;
    local_90 = (OPENSSL_STACK *)CONCAT44(local_90._4_4_,(x->ex_data).dummy);
    if (level == (X509_POLICY_LEVEL *)0x0) {
      if (pOVar8 != local_58) {
        __assert_fail("i == num_certs - 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                      ,0x2be,
                      "int X509_policy_check(const struct stack_st_X509 *, const struct stack_st_ASN1_OBJECT *, unsigned long, X509 **)"
                     );
      }
      level = x509_policy_level_new();
      if (level == (X509_POLICY_LEVEL *)0x0) goto LAB_002d4c41;
      level->has_any_policy = 1;
    }
    bVar18 = inhibit_any_policy != 0;
    local_38 = (OPENSSL_STACK *)((long)&pOVar8[-1].comp + 7);
    local_a0 = pOVar8;
    pOVar4 = (OPENSSL_STACK *)X509_get_ext_d2i(x,0x59,&local_a4,(int *)0x0);
    if (pOVar4 == (OPENSSL_STACK *)0x0) {
      if (local_a4 != -1) goto LAB_002d4c81;
      level->has_any_policy = 0;
      uVar17 = 0;
      while( true ) {
        sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)level->nodes);
        if (sVar5 <= uVar17) break;
        pXVar9 = (X509_POLICY_NODE *)OPENSSL_sk_value((OPENSSL_STACK *)level->nodes,uVar17);
        x509_policy_node_free(pXVar9);
        uVar17 = uVar17 + 1;
      }
      OPENSSL_sk_zero((OPENSSL_STACK *)level->nodes);
    }
    else {
      sVar5 = OPENSSL_sk_num(pOVar4);
      if (sVar5 == 0) {
        pOVar8 = (OPENSSL_STACK *)0x0;
        ERR_put_error(0xb,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                      ,0xfa);
LAB_002d4c6a:
        sk_X509_POLICY_NODE_pop_free((stack_st_X509_POLICY_NODE *)pOVar8,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar4);
        goto LAB_002d4c81;
      }
      uVar3 = (uint)local_90 & 0x20;
      OPENSSL_sk_set_cmp_func(pOVar4,policyinfo_cmp);
      sk_POLICYINFO_sort((stack_st_POLICYINFO *)pOVar4);
      bVar1 = 0;
      for (uVar17 = 0; sVar5 = OPENSSL_sk_num(pOVar4), uVar17 < sVar5; uVar17 = uVar17 + 1) {
        puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar4,uVar17);
        iVar2 = is_any_policy((ASN1_OBJECT *)*puVar6);
        if (iVar2 != 0) {
          bVar1 = 1;
        }
        if (uVar17 != 0) {
          puVar7 = (undefined8 *)OPENSSL_sk_value(pOVar4,uVar17 - 1);
          iVar2 = OBJ_cmp((ASN1_OBJECT *)*puVar7,(ASN1_OBJECT *)*puVar6);
          if (iVar2 == 0) {
            pOVar8 = (OPENSSL_STACK *)0x0;
            ERR_put_error(0xb,0,0x90,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                          ,0x109);
            goto LAB_002d4c6a;
          }
        }
      }
      iVar2 = level->has_any_policy;
      if (((bVar18 | pOVar8 != (OPENSSL_STACK *)0x0 & (byte)(uVar3 >> 5)) & bVar1) == 0) {
        sk_X509_POLICY_NODE_delete_if(level->nodes,delete_if_not_in_policies,pOVar4);
        level->has_any_policy = 0;
      }
      if (iVar2 == 0) {
        sk_X509_POLICY_NODE_pop_free((stack_st_X509_POLICY_NODE *)0x0,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar4);
      }
      else {
        pOVar8 = OPENSSL_sk_new_null();
        if (pOVar8 == (OPENSSL_STACK *)0x0) {
          pOVar8 = (OPENSSL_STACK *)0x0;
          goto LAB_002d4c6a;
        }
        for (uVar17 = 0; sVar5 = OPENSSL_sk_num(pOVar4), uVar17 < sVar5; uVar17 = uVar17 + 1) {
          puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar4,uVar17);
          iVar2 = is_any_policy((ASN1_OBJECT *)*puVar6);
          if (((iVar2 == 0) &&
              (pXVar9 = x509_policy_level_find(level,(ASN1_OBJECT *)*puVar6),
              pXVar9 == (X509_POLICY_NODE *)0x0)) &&
             ((pXVar9 = x509_policy_node_new((ASN1_OBJECT *)*puVar6),
              pXVar9 == (X509_POLICY_NODE *)0x0 ||
              (sVar5 = OPENSSL_sk_push(pOVar8,pXVar9), sVar5 == 0)))) {
            x509_policy_node_free(pXVar9);
            goto LAB_002d4c6a;
          }
        }
        iVar2 = x509_policy_level_add_nodes(level,(stack_st_X509_POLICY_NODE *)pOVar8);
        sk_X509_POLICY_NODE_pop_free((stack_st_X509_POLICY_NODE *)pOVar8,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar4);
        if (iVar2 == 0) goto LAB_002d4c81;
      }
    }
    pOVar4 = (OPENSSL_STACK *)0x0;
    if ((explicit_policy == 0) && (iVar2 = x509_policy_level_is_empty(level), iVar2 != 0))
    goto LAB_002d4db1;
    sVar5 = OPENSSL_sk_push(local_88,level);
    if (sVar5 != 0) {
      if (local_a0 != (OPENSSL_STACK *)0x0) {
        local_68 = policy_mapping;
        pOVar4 = (OPENSSL_STACK *)X509_get_ext_d2i(x,0x2eb,&local_a4,(int *)0x0);
        if (pOVar4 != (OPENSSL_STACK *)0x0) {
LAB_002d4784:
          if (pOVar4 == (OPENSSL_STACK *)0x0) {
LAB_002d4929:
            pOVar4 = OPENSSL_sk_new_null();
            local_a0 = (OPENSSL_STACK *)0x0;
            pXVar16 = (X509_POLICY_LEVEL *)0x0;
            pOVar8 = (OPENSSL_STACK *)0x0;
            if (pOVar4 == (OPENSSL_STACK *)0x0) goto LAB_002d4ad4;
            goto LAB_002d494f;
          }
          sVar5 = OPENSSL_sk_num(pOVar4);
          pOVar8 = pOVar4;
          if (sVar5 == 0) {
            ERR_put_error(0xb,0,0x90,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                          ,0x17b);
            pXVar16 = (X509_POLICY_LEVEL *)0x0;
            local_a0 = (OPENSSL_STACK *)0x0;
            goto LAB_002d4ad4;
          }
          uVar17 = 0;
          do {
            sVar5 = OPENSSL_sk_num(pOVar4);
            if (sVar5 <= uVar17) {
              OPENSSL_sk_set_cmp_func(pOVar4,compare_issuer_policy);
              sk_POLICY_MAPPING_sort((stack_st_POLICY_MAPPING *)pOVar4);
              if (local_68 == 0) {
                sk_X509_POLICY_NODE_delete_if(level->nodes,delete_if_mapped,pOVar4);
                sk_POLICY_MAPPING_pop_free((stack_st_POLICY_MAPPING *)pOVar4,POLICY_MAPPING_free);
                goto LAB_002d4929;
              }
              local_a0 = OPENSSL_sk_new_null();
              if (local_a0 != (OPENSSL_STACK *)0x0) {
                pAVar10 = (ASN1_OBJECT *)0x0;
                uVar17 = 0;
                goto LAB_002d485e;
              }
              break;
            }
            puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar4,uVar17);
            iVar2 = is_any_policy((ASN1_OBJECT *)*puVar6);
            if (iVar2 != 0) {
              pXVar16 = (X509_POLICY_LEVEL *)0x0;
              local_a0 = (OPENSSL_STACK *)0x0;
              goto LAB_002d4ad4;
            }
            iVar2 = is_any_policy((ASN1_OBJECT *)puVar6[1]);
            uVar17 = uVar17 + 1;
          } while (iVar2 == 0);
          local_a0 = (OPENSSL_STACK *)0x0;
          goto LAB_002d4ad1;
        }
        pXVar16 = (X509_POLICY_LEVEL *)0x0;
        local_a0 = (OPENSSL_STACK *)0x0;
        pOVar8 = (OPENSSL_STACK *)0x0;
        if (local_a4 == -1) goto LAB_002d4784;
        goto LAB_002d4ad4;
      }
      pXVar16 = (X509_POLICY_LEVEL *)0x0;
      goto LAB_002d4b0f;
    }
    goto LAB_002d4c94;
  }
LAB_002d4c41:
  level = (X509_POLICY_LEVEL *)0x0;
  pOVar4 = (OPENSSL_STACK *)0x0;
  goto LAB_002d4c94;
LAB_002d485e:
  sVar5 = OPENSSL_sk_num(pOVar4);
  if (sVar5 <= uVar17) goto LAB_002d4ab6;
  puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar4,uVar17);
  if ((pAVar10 == (ASN1_OBJECT *)0x0) ||
     (iVar2 = OBJ_cmp((ASN1_OBJECT *)*puVar6,pAVar10), iVar2 != 0)) {
    pAVar10 = (ASN1_OBJECT *)*puVar6;
    pXVar9 = x509_policy_level_find(level,(ASN1_OBJECT *)pAVar10);
    if (pXVar9 == (X509_POLICY_NODE *)0x0) {
      if (level->has_any_policy == 0) goto LAB_002d48e9;
      pXVar9 = x509_policy_node_new((ASN1_OBJECT *)*puVar6);
      if ((pXVar9 == (X509_POLICY_NODE *)0x0) ||
         (sVar5 = OPENSSL_sk_push(local_a0,pXVar9), sVar5 == 0)) {
        x509_policy_node_free(pXVar9);
        goto LAB_002d4aa9;
      }
    }
    pXVar9->mapped = 1;
  }
LAB_002d48e9:
  uVar17 = uVar17 + 1;
  goto LAB_002d485e;
LAB_002d4ab6:
  iVar2 = x509_policy_level_add_nodes(level,(stack_st_X509_POLICY_NODE *)local_a0);
  if (iVar2 == 0) goto LAB_002d4ad1;
LAB_002d494f:
  uVar17 = 0;
LAB_002d4954:
  sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)level->nodes);
  if (sVar5 <= uVar17) goto LAB_002d49cb;
  puVar6 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)level->nodes,uVar17);
  if (*(int *)(puVar6 + 2) != 0) {
LAB_002d49c6:
    uVar17 = uVar17 + 1;
    goto LAB_002d4954;
  }
  a = POLICY_MAPPING_new();
  if (a == (POLICY_MAPPING *)0x0) goto LAB_002d4aa9;
  pAVar10 = OBJ_dup((ASN1_OBJECT *)*puVar6);
  a->issuerDomainPolicy = pAVar10;
  pAVar10 = OBJ_dup((ASN1_OBJECT *)*puVar6);
  a->subjectDomainPolicy = pAVar10;
  if (((a->issuerDomainPolicy != (ASN1_OBJECT *)0x0) && (pAVar10 != (ASN1_OBJECT *)0x0)) &&
     (sVar5 = OPENSSL_sk_push(pOVar4,a), sVar5 != 0)) goto LAB_002d49c6;
  POLICY_MAPPING_free(a);
LAB_002d4aa9:
  pXVar16 = (X509_POLICY_LEVEL *)0x0;
  pOVar8 = pOVar4;
LAB_002d4ad4:
  x509_policy_level_free(pXVar16);
  pXVar16 = (X509_POLICY_LEVEL *)0x0;
  pOVar4 = pOVar8;
  goto LAB_002d4adf;
LAB_002d49cb:
  OPENSSL_sk_set_cmp_func(pOVar4,compare_subject_policy);
  sk_POLICY_MAPPING_sort((stack_st_POLICY_MAPPING *)pOVar4);
  pXVar16 = x509_policy_level_new();
  if (pXVar16 == (X509_POLICY_LEVEL *)0x0) {
LAB_002d4ad1:
    pXVar16 = (X509_POLICY_LEVEL *)0x0;
    pOVar8 = pOVar4;
    goto LAB_002d4ad4;
  }
  pXVar16->has_any_policy = level->has_any_policy;
  pXVar9 = (X509_POLICY_NODE *)0x0;
  for (uVar17 = 0; sVar5 = OPENSSL_sk_num(pOVar4), uVar17 < sVar5; uVar17 = uVar17 + 1) {
    puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar4,uVar17);
    if ((level->has_any_policy != 0) ||
       (pXVar11 = x509_policy_level_find(level,(ASN1_OBJECT *)*puVar6),
       pXVar11 != (X509_POLICY_NODE *)0x0)) {
      pOVar8 = pOVar4;
      if (((pXVar9 == (X509_POLICY_NODE *)0x0) ||
          (iVar2 = OBJ_cmp((ASN1_OBJECT *)pXVar9->policy,(ASN1_OBJECT *)puVar6[1]), iVar2 != 0)) &&
         ((pXVar9 = x509_policy_node_new((ASN1_OBJECT *)puVar6[1]),
          pXVar9 == (X509_POLICY_NODE *)0x0 ||
          (sVar5 = OPENSSL_sk_push((OPENSSL_STACK *)pXVar16->nodes,pXVar9), sVar5 == 0)))) {
        x509_policy_node_free(pXVar9);
        goto LAB_002d4ad4;
      }
      sVar5 = OPENSSL_sk_push((OPENSSL_STACK *)pXVar9->parent_policies,(void *)*puVar6);
      if (sVar5 == 0) goto LAB_002d4ad4;
      *puVar6 = 0;
    }
  }
  sk_X509_POLICY_NODE_sort(pXVar16->nodes);
LAB_002d4adf:
  sk_POLICY_MAPPING_pop_free((stack_st_POLICY_MAPPING *)pOVar4,POLICY_MAPPING_free);
  sk_X509_POLICY_NODE_pop_free((stack_st_X509_POLICY_NODE *)local_a0,x509_policy_node_free);
  if (pXVar16 == (X509_POLICY_LEVEL *)0x0) {
    level = (X509_POLICY_LEVEL *)0x0;
    goto LAB_002d4c81;
  }
  level = pXVar16;
  if (((ulong)local_90 & 0x20) == 0) {
LAB_002d4b0f:
    if (explicit_policy != 0) {
      explicit_policy = explicit_policy - 1;
    }
    if (policy_mapping != 0) {
      policy_mapping = policy_mapping - 1;
    }
    level = pXVar16;
    if (inhibit_any_policy != 0) {
      inhibit_any_policy = inhibit_any_policy - 1;
    }
  }
  a_00 = (POLICY_CONSTRAINTS *)X509_get_ext_d2i(x,0x191,&local_a4,(int *)0x0);
  if ((a_00 == (POLICY_CONSTRAINTS *)0x0) && (local_a4 != -1)) goto LAB_002d4c81;
  if (a_00 != (POLICY_CONSTRAINTS *)0x0) {
    if (((ASN1_INTEGER *)a_00->requireExplicitPolicy == (ASN1_INTEGER *)0x0) &&
       (a_00->inhibitPolicyMapping == (ASN1_INTEGER *)0x0)) {
      ERR_put_error(0xb,0,0x90,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                    ,0x22f);
    }
    else {
      iVar2 = apply_skip_certs((ASN1_INTEGER *)a_00->requireExplicitPolicy,&explicit_policy);
      if (iVar2 != 0) {
        iVar2 = apply_skip_certs((ASN1_INTEGER *)a_00->inhibitPolicyMapping,&policy_mapping);
        POLICY_CONSTRAINTS_free(a_00);
        if (iVar2 == 0) goto LAB_002d4c81;
        goto LAB_002d4bb6;
      }
    }
    POLICY_CONSTRAINTS_free(a_00);
    goto LAB_002d4c81;
  }
LAB_002d4bb6:
  skip_certs = (ASN1_INTEGER *)X509_get_ext_d2i(x,0x2ec,&local_a4,(int *)0x0);
  if ((skip_certs == (ASN1_INTEGER *)0x0) && (local_a4 != -1)) goto LAB_002d4c81;
  iVar2 = apply_skip_certs(skip_certs,&inhibit_any_policy);
  ASN1_INTEGER_free((ASN1_INTEGER *)skip_certs);
  pOVar8 = local_38;
  if (iVar2 == 0) goto LAB_002d4c81;
  goto LAB_002d4497;
LAB_002d4c81:
  *(X509 **)&local_50->stack = x;
  local_98 = (OPENSSL_STACK *)0x2a;
LAB_002d4c91:
  pOVar4 = (OPENSSL_STACK *)0x0;
  goto LAB_002d4c94;
  while( true ) {
    pAVar14 = (ASN1_OBJECT *)OPENSSL_sk_value(pOVar4,uVar17);
    iVar2 = is_any_policy(pAVar14);
    uVar17 = uVar17 + 1;
    if (iVar2 != 0) break;
LAB_002d4dfd:
    sVar13 = OPENSSL_sk_num(pOVar4);
    if (sVar13 <= uVar17) {
      local_90 = pOVar4;
      if (sVar5 == 0) {
LAB_002d4f61:
        local_98 = (OPENSSL_STACK *)0x0;
        pOVar4 = local_90;
      }
      else if (pXVar16->has_any_policy == 0) {
        for (uVar17 = 0; sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar16->nodes), uVar17 < sVar5;
            uVar17 = uVar17 + 1) {
          pvVar15 = OPENSSL_sk_value((OPENSSL_STACK *)pXVar16->nodes,uVar17);
          *(undefined4 *)((long)pvVar15 + 0x14) = 1;
        }
        while (local_a0 = pOVar12, pOVar4 = pOVar8, pOVar4 < local_a0) {
          puVar6 = (undefined8 *)OPENSSL_sk_value(local_88,(size_t)pOVar4);
          local_98 = (OPENSSL_STACK *)((long)&pOVar4[-1].comp + 7);
          for (uVar17 = 0; sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar6), pOVar8 = local_98,
              pOVar12 = local_a0, uVar17 < sVar5; uVar17 = uVar17 + 1) {
            puVar7 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)*puVar6,uVar17);
            if (*(int *)((long)puVar7 + 0x14) != 0) {
              sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)puVar7[1]);
              if (sVar5 == 0) {
                iVar2 = sk_ASN1_OBJECT_find((stack_st_ASN1_OBJECT *)local_90,(size_t *)0x0,
                                            (ASN1_OBJECT *)*puVar7);
                if (iVar2 != 0) goto LAB_002d4f61;
              }
              else if (pOVar4 != (OPENSSL_STACK *)0x0) {
                pXVar16 = (X509_POLICY_LEVEL *)OPENSSL_sk_value(local_88,(size_t)local_98);
                for (i_00 = 0; sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)puVar7[1]), i_00 < sVar5;
                    i_00 = i_00 + 1) {
                  pAVar14 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)puVar7[1],i_00);
                  pXVar9 = x509_policy_level_find(pXVar16,pAVar14);
                  if (pXVar9 != (X509_POLICY_NODE *)0x0) {
                    pXVar9->reachable = 1;
                  }
                }
              }
            }
          }
        }
        local_98 = (OPENSSL_STACK *)0x2b;
        pOVar4 = local_90;
      }
      else {
LAB_002d4ce4:
        local_98 = (OPENSSL_STACK *)0x0;
      }
      goto LAB_002d4c94;
    }
  }
  local_98 = (OPENSSL_STACK *)0x0;
LAB_002d4c94:
  x509_policy_level_free(level);
  OPENSSL_sk_free(pOVar4);
  sk_X509_POLICY_LEVEL_pop_free((stack_st_X509_POLICY_LEVEL *)local_88,x509_policy_level_free);
  return (int)local_98;
}

Assistant:

int X509_policy_check(const STACK_OF(X509) *certs,
                      const STACK_OF(ASN1_OBJECT) *user_policies,
                      unsigned long flags, X509 **out_current_cert) {
  *out_current_cert = NULL;
  int ret = X509_V_ERR_OUT_OF_MEM;
  X509_POLICY_LEVEL *level = NULL;
  STACK_OF(X509_POLICY_LEVEL) *levels = NULL;
  STACK_OF(ASN1_OBJECT) *user_policies_sorted = NULL;
  size_t num_certs = sk_X509_num(certs);

  // Skip policy checking if the chain is just the trust anchor.
  if (num_certs <= 1) {
    return X509_V_OK;
  }

  // See RFC 5280, section 6.1.2, steps (d) through (f).
  size_t explicit_policy =
      (flags & X509_V_FLAG_EXPLICIT_POLICY) ? 0 : num_certs + 1;
  size_t inhibit_any_policy =
      (flags & X509_V_FLAG_INHIBIT_ANY) ? 0 : num_certs + 1;
  size_t policy_mapping = (flags & X509_V_FLAG_INHIBIT_MAP) ? 0 : num_certs + 1;

  levels = sk_X509_POLICY_LEVEL_new_null();
  if (levels == NULL) {
    goto err;
  }

  for (size_t i = num_certs - 2; i < num_certs; i--) {
    X509 *cert = sk_X509_value(certs, i);
    if (!x509v3_cache_extensions(cert)) {
      goto err;
    }
    const int is_self_issued = (cert->ex_flags & EXFLAG_SI) != 0;

    if (level == NULL) {
      assert(i == num_certs - 2);
      level = x509_policy_level_new();
      if (level == NULL) {
        goto err;
      }
      level->has_any_policy = 1;
    }

    // RFC 5280, section 6.1.3, steps (d) and (e). |any_policy_allowed| is
    // computed as in step (d.2).
    const int any_policy_allowed =
        inhibit_any_policy > 0 || (i > 0 && is_self_issued);
    if (!process_certificate_policies(cert, level, any_policy_allowed)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }

    // RFC 5280, section 6.1.3, step (f).
    if (explicit_policy == 0 && x509_policy_level_is_empty(level)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }

    // Insert into the list.
    if (!sk_X509_POLICY_LEVEL_push(levels, level)) {
      goto err;
    }
    X509_POLICY_LEVEL *current_level = level;
    level = NULL;

    // If this is not the leaf certificate, we go to section 6.1.4. If it
    // is the leaf certificate, we go to section 6.1.5 instead.
    if (i != 0) {
      // RFC 5280, section 6.1.4, steps (a) and (b).
      level = process_policy_mappings(cert, current_level, policy_mapping > 0);
      if (level == NULL) {
        ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
        *out_current_cert = cert;
        goto err;
      }
    }

    // RFC 5280, section 6.1.4, step (h-j) for non-leaves, and section 6.1.5,
    // step (a-b) for leaves. In the leaf case, RFC 5280 says only to update
    // |explicit_policy|, but |policy_mapping| and |inhibit_any_policy| are no
    // longer read at this point, so we use the same process.
    if (i == 0 || !is_self_issued) {
      if (explicit_policy > 0) {
        explicit_policy--;
      }
      if (policy_mapping > 0) {
        policy_mapping--;
      }
      if (inhibit_any_policy > 0) {
        inhibit_any_policy--;
      }
    }
    if (!process_policy_constraints(cert, &explicit_policy, &policy_mapping,
                                    &inhibit_any_policy)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }
  }

  // RFC 5280, section 6.1.5, step (g). We do not output the policy set, so it
  // is only necessary to check if the user-constrained-policy-set is not empty.
  if (explicit_policy == 0) {
    // Build a sorted copy of |user_policies| for more efficient lookup.
    if (user_policies != NULL) {
      user_policies_sorted = sk_ASN1_OBJECT_dup(user_policies);
      if (user_policies_sorted == NULL) {
        goto err;
      }
      sk_ASN1_OBJECT_set_cmp_func(user_policies_sorted, asn1_object_cmp);
      sk_ASN1_OBJECT_sort(user_policies_sorted);
    }

    if (!has_explicit_policy(levels, user_policies_sorted)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }
  }

  ret = X509_V_OK;

err:
  x509_policy_level_free(level);
  // |user_policies_sorted|'s contents are owned by |user_policies|, so we do
  // not use |sk_ASN1_OBJECT_pop_free|.
  sk_ASN1_OBJECT_free(user_policies_sorted);
  sk_X509_POLICY_LEVEL_pop_free(levels, x509_policy_level_free);
  return ret;
}